

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O3

void __thiscall
CTcMake::create_dir(CTcMake *this,CTcHostIfc *hostifc,char *path,int is_file,int *errcnt)

{
  int iVar1;
  char dir [4096];
  char local_1028 [4104];
  
  if ((is_file != 0) &&
     (os_get_path_name(local_1028,0x1000,path), path = local_1028, local_1028[0] == '\0')) {
    return;
  }
  iVar1 = access(path,0);
  if (iVar1 != 0) {
    CTcHostIfc::print_step(hostifc,"creating output directory %s\n",path);
    iVar1 = os_mkdir(path,1);
    if (iVar1 == 0) {
      CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2972,path);
      *errcnt = *errcnt + 1;
    }
  }
  return;
}

Assistant:

void CTcMake::create_dir(CTcHostIfc *hostifc,
                         const char *path, int is_file, int *errcnt)
{
    char dir[OSFNMAX];

    /*
     *   If the path includes a filename portion, remove it to get the parent
     *   directory path.
     */
    if (is_file)
    {
        /* extract the directory path portion */
        os_get_path_name(dir, sizeof(dir), path);
        path = dir;

        /* don't do anything if there's no path */
        if (strlen(dir) == 0)
            return;
    }

    /* if the directory doesn't already exist, create it */
    if (osfacc(path))
    {
        /* mention it */
        hostifc->print_step("creating output directory %s\n", path);
        
        /* try creating the folder */
        if (!os_mkdir(path, TRUE))
        {
            /* failed - log the error */
            G_tcmain->log_error(0, 0, TC_SEV_ERROR,
                                TCERR_CANNOT_CREATE_DIR, path);
            
            /* count it */
            *errcnt += 1;
        }
    }
}